

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glw_json.h
# Opt level: O1

bool __thiscall json::LoadObject::process<unsigned_int>(LoadObject *this,char *name,uint *value)

{
  prop_map *papVar1;
  char *__nptr;
  size_t sVar2;
  int iVar3;
  char *in_RAX;
  int *piVar4;
  ulong uVar5;
  char *local_38;
  
  local_38 = in_RAX;
  iVar3 = strcmp(this->_prev_name,name);
  if (-1 < iVar3) {
    __assert_fail("false && \"variables should be serialized in alphabetical order\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/yak32[P]glw_json/tests/../glw_json.h"
                  ,0x10c,"bool json::LoadObject::process(const char *, V &) [V = unsigned int]");
  }
  this->_prev_name = name;
  uVar5 = this->current;
  if (uVar5 < this->props_size) {
    papVar1 = this->props;
    iVar3 = strncmp(name,(*papVar1)[uVar5].param.str,(*papVar1)[uVar5].param.len);
    if (iVar3 == 0) {
      __nptr = (*papVar1)[uVar5].value.str;
      sVar2 = (*papVar1)[uVar5].value.len;
      piVar4 = __errno_location();
      *piVar4 = 0;
      uVar5 = strtoul(__nptr,&local_38,10);
      if (local_38 < __nptr + sVar2) {
        uVar5 = strtoul(__nptr,&local_38,0x10);
      }
      *value = (uint)uVar5;
      if ((((*piVar4 == 0x22) || (0xfffffffe < uVar5)) || (local_38 != __nptr + sVar2)) ||
         (*__nptr == '-')) {
        local_38 = __nptr;
      }
      sVar2 = this->current;
      if (local_38 == (*this->props)[sVar2].value.str + (*this->props)[sVar2].value.len) {
        this->current = sVar2 + 1;
        return true;
      }
      this->error_pos = local_38;
      goto LAB_0014e1f9;
    }
  }
  if ((this->options & 2U) == 0) {
    if ((this->options & 1U) == 0) {
      return true;
    }
    *value = 0;
    return true;
  }
LAB_0014e1f9:
  this->current = this->props_size;
  return false;
}

Assistant:

bool process(const char* name, V& value) {
#ifndef NDEBUG
		// this check could fail if name is dynamically allocated and was freed after usage
		// if Sublime Text 3 is used, select everything inside serialize() and press F9
		if (strcmp(_prev_name, name) >= 0)
			assert(false && "variables should be serialized in alphabetical order");
		_prev_name = name;
#endif
		if (current < props_size &&
			strncmp(name, props[current].param.str, props[current].param.len) == 0) {
			const char* end =
				load(props[current].value.str, props[current].value.len, value, options);
			if (end == props[current].value.str + props[current].value.len) {
				++current;
				return true;
			}
			error_pos = end;
		}
		else if (!(options & ERROR_IF_ABSENT)) {
			if (options & RESET_IF_ABSENT)
				value = V();
			return true;
		}
		current = props_size; // skip parsing
		return false;
	}